

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O0

void __thiscall QPrintDialogPrivate::updateWidgets(QPrintDialogPrivate *this)

{
  QRadioButton *pQVar1;
  QCheckBox *pQVar2;
  QSpinBox *pQVar3;
  bool bVar4;
  PrintRange PVar5;
  int iVar6;
  QPrintDialog *pQVar7;
  int *b;
  undefined7 uVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  QPrintDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  int maxPage;
  int minPage;
  QPrintDialog *q;
  QAbstractPrintDialog *in_stack_ffffffffffffff70;
  QSpinBox *this_00;
  undefined8 in_stack_ffffffffffffff78;
  PrintDialogOption option;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QUnixPrintWidgetPrivate *this_01;
  bool local_39;
  int local_1c [3];
  int local_10 [2];
  long local_8;
  
  option = (PrintDialogOption)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = q_func(in_RDI);
  this_01 = (QUnixPrintWidgetPrivate *)(in_RDI->options).super_Ui_QPrintSettingsOutput.gbPrintRange;
  bVar4 = QPrintDialog::testOption
                    ((QPrintDialog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     option);
  uVar8 = (undefined7)((ulong)pQVar7 >> 8);
  local_39 = true;
  if (!bVar4) {
    bVar4 = QPrintDialog::testOption
                      ((QPrintDialog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                       ,option);
    local_39 = true;
    if (!bVar4) {
      local_39 = QPrintDialog::testOption
                           ((QPrintDialog *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),option);
    }
  }
  (**(code **)&this_01->parent[2].field_0x8)(this_01,local_39);
  pQVar1 = (in_RDI->options).super_Ui_QPrintSettingsOutput.printRange;
  QPrintDialog::testOption
            ((QPrintDialog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),option);
  QWidget::setEnabled(SUB81(pQVar1,0));
  pQVar1 = (in_RDI->options).super_Ui_QPrintSettingsOutput.printSelection;
  bVar4 = QPrintDialog::testOption
                    ((QPrintDialog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     option);
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,bVar4,extraout_RDX,CONCAT71(uVar8,bVar4));
  pQVar1 = (in_RDI->options).super_Ui_QPrintSettingsOutput.printCurrentPage;
  bVar4 = QPrintDialog::testOption
                    ((QPrintDialog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     option);
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,bVar4,extraout_RDX_00,bVar4);
  pQVar2 = (in_RDI->options).super_Ui_QPrintSettingsOutput.collate;
  bVar4 = QPrintDialog::testOption
                    ((QPrintDialog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     option);
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,bVar4,extraout_RDX_01,bVar4);
  PVar5 = QAbstractPrintDialog::printRange(in_stack_ffffffffffffff70);
  switch(PVar5) {
  case AllPages:
    QAbstractButton::setChecked(SUB81((in_RDI->options).super_Ui_QPrintSettingsOutput.printAll,0));
    QWidget::setEnabled(SUB81((in_RDI->options).super_Ui_QPrintSettingsOutput.pageSetCombo,0));
    break;
  case Selection:
    QAbstractButton::setChecked
              (SUB81((in_RDI->options).super_Ui_QPrintSettingsOutput.printSelection,0));
    QWidget::setEnabled(SUB81((in_RDI->options).super_Ui_QPrintSettingsOutput.pageSetCombo,0));
    break;
  case PageRange:
    QAbstractButton::setChecked(SUB81((in_RDI->options).super_Ui_QPrintSettingsOutput.printRange,0))
    ;
    QWidget::setEnabled(SUB81((in_RDI->options).super_Ui_QPrintSettingsOutput.pageSetCombo,0));
    break;
  case CurrentPage:
    bVar4 = QPrintDialog::testOption
                      ((QPrintDialog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                       ,option);
    if (bVar4) {
      QAbstractButton::setChecked
                (SUB81((in_RDI->options).super_Ui_QPrintSettingsOutput.printCurrentPage,0));
      QWidget::setEnabled(SUB81((in_RDI->options).super_Ui_QPrintSettingsOutput.pageSetCombo,0));
    }
  }
  local_10[1] = 1;
  local_10[0] = QAbstractPrintDialog::minPage(in_stack_ffffffffffffff70);
  local_1c[2] = QAbstractPrintDialog::maxPage(in_stack_ffffffffffffff70);
  b = qMin<int>(local_10,local_1c + 2);
  qMax<int>(local_10 + 1,b);
  local_1c[1] = 1;
  iVar6 = QAbstractPrintDialog::maxPage(in_stack_ffffffffffffff70);
  if (iVar6 == 0x7fffffff) {
    local_1c[0] = 9999;
  }
  else {
    local_1c[0] = QAbstractPrintDialog::maxPage(in_stack_ffffffffffffff70);
  }
  qMax<int>(local_1c + 1,local_1c);
  QSpinBox::setMinimum((int)(in_RDI->options).super_Ui_QPrintSettingsOutput.from);
  QSpinBox::setMinimum((int)(in_RDI->options).super_Ui_QPrintSettingsOutput.to);
  QSpinBox::setMaximum((int)(in_RDI->options).super_Ui_QPrintSettingsOutput.from);
  QSpinBox::setMaximum((int)(in_RDI->options).super_Ui_QPrintSettingsOutput.to);
  this_00 = (in_RDI->options).super_Ui_QPrintSettingsOutput.from;
  QAbstractPrintDialog::fromPage((QAbstractPrintDialog *)this_00);
  QSpinBox::setValue((int)this_00);
  pQVar3 = (in_RDI->options).super_Ui_QPrintSettingsOutput.to;
  QAbstractPrintDialog::toPage((QAbstractPrintDialog *)this_00);
  QSpinBox::setValue((int)pQVar3);
  QUnixPrintWidgetPrivate::updateWidget(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPrintDialogPrivate::updateWidgets()
{
    Q_Q(QPrintDialog);
    options.gbPrintRange->setVisible(q->testOption(QPrintDialog::PrintPageRange) ||
                                     q->testOption(QPrintDialog::PrintSelection) ||
                                     q->testOption(QPrintDialog::PrintCurrentPage));

    options.printRange->setEnabled(q->testOption(QPrintDialog::PrintPageRange));
    options.printSelection->setVisible(q->testOption(QPrintDialog::PrintSelection));
    options.printCurrentPage->setVisible(q->testOption(QPrintDialog::PrintCurrentPage));
    options.collate->setVisible(q->testOption(QPrintDialog::PrintCollateCopies));

#if QT_CONFIG(cups)
    // Don't display Page Set if only Selection or Current Page are enabled
    if (!q->testOption(QPrintDialog::PrintPageRange)
        && (q->testOption(QPrintDialog::PrintSelection) || q->testOption(QPrintDialog::PrintCurrentPage))) {
        options.pageSetCombo->setVisible(false);
        options.pageSetLabel->setVisible(false);
    } else {
        options.pageSetCombo->setVisible(true);
        options.pageSetLabel->setVisible(true);
    }

    if (!q->testOption(QPrintDialog::PrintPageRange)) {
        // If we can do CUPS server side pages selection,
        // display the page range widgets
        options.gbPrintRange->setVisible(true);
        options.printRange->setEnabled(true);
    }
#endif

    switch (q->printRange()) {
    case QPrintDialog::AllPages:
        options.printAll->setChecked(true);
        options.pageSetCombo->setEnabled(true);
        break;
    case QPrintDialog::Selection:
        options.printSelection->setChecked(true);
        options.pageSetCombo->setEnabled(false);
        break;
    case QPrintDialog::PageRange:
        options.printRange->setChecked(true);
        options.pageSetCombo->setEnabled(true);
        break;
    case QPrintDialog::CurrentPage:
        if (q->testOption(QPrintDialog::PrintCurrentPage)) {
            options.printCurrentPage->setChecked(true);
            options.pageSetCombo->setEnabled(false);
        }
        break;
    default:
        break;
    }
    const int minPage = qMax(1, qMin(q->minPage() , q->maxPage()));
    const int maxPage = qMax(1, q->maxPage() == INT_MAX ? 9999 : q->maxPage());

    options.from->setMinimum(minPage);
    options.to->setMinimum(minPage);
    options.from->setMaximum(maxPage);
    options.to->setMaximum(maxPage);

    options.from->setValue(q->fromPage());
    options.to->setValue(q->toPage());
    top->d->updateWidget();
}